

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O3

int lws_tls_server_new_nonblocking(lws *wsi,lws_sockfd_type accept_fd)

{
  uint uVar1;
  uint *puVar2;
  SSL *ssl;
  BIO *pBVar3;
  int iVar4;
  
  puVar2 = (uint *)__errno_location();
  *puVar2 = 0;
  ERR_clear_error();
  ssl = SSL_new((SSL_CTX *)(wsi->vhost->tls).ssl_ctx);
  (wsi->tls).ssl = (lws_tls_conn *)ssl;
  if (ssl == (SSL *)0x0) {
    uVar1 = lws_ssl_get_error(wsi,0);
    iVar4 = 1;
    _lws_log(1,"SSL_new failed: %d (errno %d)\n",(ulong)uVar1,(ulong)*puVar2);
    lws_tls_err_describe_clear();
  }
  else {
    SSL_set_ex_data(ssl,openssl_websocket_private_data_index,wsi);
    SSL_set_fd((SSL *)(wsi->tls).ssl,accept_fd);
    SSL_ctrl((SSL *)(wsi->tls).ssl,0x21,0x12,(void *)0x0);
    pBVar3 = SSL_get_rbio((SSL *)(wsi->tls).ssl);
    if (pBVar3 == (BIO *)0x0) {
      _lws_log(4,"NULL rbio\n");
    }
    else {
      BIO_ctrl(pBVar3,0x66,1,(void *)0x0);
    }
    pBVar3 = SSL_get_wbio((SSL *)(wsi->tls).ssl);
    if (pBVar3 == (BIO *)0x0) {
      _lws_log(4,"NULL rbio\n");
    }
    else {
      BIO_ctrl(pBVar3,0x66,1,(void *)0x0);
    }
    iVar4 = 0;
    if ((wsi->vhost->tls).ssl_info_event_mask != 0) {
      SSL_set_info_callback((SSL *)(wsi->tls).ssl,lws_ssl_info_callback);
    }
  }
  return iVar4;
}

Assistant:

int
lws_tls_server_new_nonblocking(struct lws *wsi, lws_sockfd_type accept_fd)
{
#if !defined(USE_WOLFSSL)
	BIO *bio;
#endif

	errno = 0;
	ERR_clear_error();
	wsi->tls.ssl = SSL_new(wsi->vhost->tls.ssl_ctx);
	if (wsi->tls.ssl == NULL) {
		lwsl_err("SSL_new failed: %d (errno %d)\n",
			 lws_ssl_get_error(wsi, 0), errno);

		lws_tls_err_describe_clear();
		return 1;
	}

	SSL_set_ex_data(wsi->tls.ssl, openssl_websocket_private_data_index, wsi);
	SSL_set_fd(wsi->tls.ssl, (int)(long long)accept_fd);

#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
	CyaSSL_set_using_nonblock(wsi->tls.ssl, 1);
#else
	wolfSSL_set_using_nonblock(wsi->tls.ssl, 1);
#endif
#else

	SSL_set_mode(wsi->tls.ssl, SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER |
				   SSL_MODE_RELEASE_BUFFERS);
	bio = SSL_get_rbio(wsi->tls.ssl);
	if (bio)
		BIO_set_nbio(bio, 1); /* nonblocking */
	else
		lwsl_notice("NULL rbio\n");
	bio = SSL_get_wbio(wsi->tls.ssl);
	if (bio)
		BIO_set_nbio(bio, 1); /* nonblocking */
	else
		lwsl_notice("NULL rbio\n");
#endif

#if defined (LWS_HAVE_SSL_SET_INFO_CALLBACK)
		if (wsi->vhost->tls.ssl_info_event_mask)
			SSL_set_info_callback(wsi->tls.ssl, lws_ssl_info_callback);
#endif

	return 0;
}